

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_pack(REF_INTERP ref_interp,REF_INT *n2o)

{
  uint uVar1;
  uint max;
  int iVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  
  if (ref_interp == (REF_INTERP)0x0) {
    return 0;
  }
  uVar1 = ref_interp->to_grid->node->n;
  lVar13 = (long)(int)uVar1;
  max = ref_interp->max;
  uVar11 = (ulong)max;
  if (((int)max < (int)uVar1) && (uVar4 = ref_interp_resize(ref_interp,max), uVar4 != 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x13a,
           "ref_interp_pack",(ulong)uVar4,"match node max");
    return uVar4;
  }
  lVar5 = (long)ref_interp->ref_agents->n;
  if (lVar5 == 0) {
    uVar6 = 0;
    uVar8 = 0;
    if (0 < (int)max) {
      uVar8 = (ulong)max;
    }
    do {
      if (uVar8 == uVar6) {
        if ((int)max < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x142,"ref_interp_pack","malloc int_copy of REF_INT negative");
          return 1;
        }
        pvVar7 = malloc(uVar11 * 4);
        if (pvVar7 == (void *)0x0) {
          pcVar12 = "malloc int_copy of REF_INT NULL";
          uVar9 = 0x142;
        }
        else {
          for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
            *(REF_INT *)((long)pvVar7 + uVar6 * 4) = ref_interp->cell[uVar6];
          }
          uVar6 = 0;
          uVar8 = 0;
          if (0 < (int)uVar1) {
            uVar8 = (ulong)uVar1;
          }
          for (; lVar5 = lVar13, uVar8 != uVar6; uVar6 = uVar6 + 1) {
            ref_interp->cell[uVar6] = *(REF_INT *)((long)pvVar7 + (long)n2o[uVar6] * 4);
          }
          for (; lVar5 < (long)uVar11; lVar5 = lVar5 + 1) {
            ref_interp->cell[lVar5] = -1;
          }
          for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
            *(REF_INT *)((long)pvVar7 + uVar6 * 4) = ref_interp->part[uVar6];
          }
          for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
            ref_interp->part[uVar6] = *(REF_INT *)((long)pvVar7 + (long)n2o[uVar6] * 4);
          }
          for (; lVar13 < (long)uVar11; lVar13 = lVar13 + 1) {
            ref_interp->part[lVar13] = -1;
          }
          free(pvVar7);
          pvVar7 = malloc((ulong)(max * 4) << 3);
          if (pvVar7 != (void *)0x0) {
            for (uVar6 = 0; uVar6 != uVar11; uVar6 = uVar6 + 1) {
              uVar10 = (ulong)((uint)uVar6 & 0x3fffffff);
              pRVar3 = ref_interp->bary;
              for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
                *(REF_DBL *)((long)pvVar7 + lVar13 * 8 + uVar10 * 0x20) =
                     pRVar3[uVar10 * 4 + lVar13];
              }
            }
            lVar13 = 0;
            for (uVar11 = 0; uVar11 != uVar8; uVar11 = uVar11 + 1) {
              iVar2 = n2o[uVar11];
              pRVar3 = ref_interp->bary;
              for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
                *(undefined8 *)((long)pRVar3 + lVar5 * 8 + lVar13) =
                     *(undefined8 *)((long)pvVar7 + lVar5 * 8 + (long)(iVar2 << 2) * 8);
              }
              lVar13 = lVar13 + 0x20;
            }
            free(pvVar7);
            return 0;
          }
          pcVar12 = "malloc dbl_copy of REF_DBL NULL";
          uVar9 = 0x157;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               uVar9,"ref_interp_pack",pcVar12);
        return 2;
      }
      lVar5 = (long)ref_interp->agent_hired[uVar6];
      uVar6 = uVar6 + 1;
    } while (lVar5 == 0);
    pcVar12 = "can\'t pack hired agents";
    uVar9 = 0x13f;
  }
  else {
    pcVar12 = "can\'t pack active agents";
    uVar9 = 0x13c;
  }
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar9,
         "ref_interp_pack",pcVar12,0,lVar5);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_interp_pack(REF_INTERP ref_interp, REF_INT *n2o) {
  REF_INT *int_copy;
  REF_DBL *dbl_copy;
  REF_INT i, node, n, max;

  if (NULL == ref_interp) return REF_SUCCESS;

  n = ref_node_n(ref_grid_node(ref_interp_to_grid(ref_interp)));
  max = ref_interp_max(ref_interp);
  if (n > max) {
    RSS(ref_interp_resize(ref_interp, max), "match node max");
  }
  REIS(0, ref_agents_n(ref_interp->ref_agents), "can't pack active agents");

  for (node = 0; node < max; node++) {
    REIS(REF_FALSE, ref_interp->agent_hired[node], "can't pack hired agents");
  }

  ref_malloc(int_copy, max, REF_INT);
  for (node = 0; node < max; node++) {
    int_copy[node] = ref_interp->cell[node];
  }
  for (node = 0; node < n; node++) {
    ref_interp->cell[node] = int_copy[n2o[node]];
  }
  for (node = n; node < max; node++) {
    ref_interp->cell[node] = REF_EMPTY;
  }
  for (node = 0; node < max; node++) {
    int_copy[node] = ref_interp->part[node];
  }
  for (node = 0; node < n; node++) {
    ref_interp->part[node] = int_copy[n2o[node]];
  }
  for (node = n; node < max; node++) {
    ref_interp->part[node] = REF_EMPTY;
  }
  ref_free(int_copy);

  ref_malloc(dbl_copy, 4 * max, REF_DBL);
  for (node = 0; node < max; node++) {
    for (i = 0; i < 4; i++) {
      dbl_copy[i + 4 * node] = ref_interp->bary[i + 4 * node];
    }
  }
  for (node = 0; node < n; node++) {
    for (i = 0; i < 4; i++) {
      ref_interp->bary[i + 4 * node] = dbl_copy[i + 4 * n2o[node]];
    }
  }
  ref_free(dbl_copy);

  return REF_SUCCESS;
}